

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddReord.c
# Opt level: O1

int cuddZddSifting(DdManager *table,int lower,int upper)

{
  uint initial_size;
  DdSubtable *pDVar1;
  int *piVar2;
  int iVar3;
  int *piVar4;
  void *__base;
  DdNode *pDVar5;
  DdNode *pDVar6;
  size_t sVar7;
  int iVar8;
  DdNode *pDVar9;
  size_t __nmemb;
  DdNode *moves;
  long lVar10;
  
  iVar8 = table->sizeZ;
  __nmemb = (size_t)iVar8;
  piVar4 = (int *)malloc(__nmemb * 4);
  zdd_entry = piVar4;
  if ((piVar4 == (int *)0x0) || (__base = malloc(__nmemb * 4), __base == (void *)0x0)) {
    table->errorCode = CUDD_MEMORY_OUT;
    __base = (void *)0x0;
LAB_007f5dce:
    if (zdd_entry != (int *)0x0) {
      free(zdd_entry);
      zdd_entry = (int *)0x0;
    }
    iVar8 = 0;
    if (__base != (void *)0x0) {
      free(__base);
      iVar8 = 0;
    }
  }
  else {
    if (0 < iVar8) {
      pDVar1 = table->subtableZ;
      piVar2 = table->permZ;
      sVar7 = 0;
      do {
        piVar4[sVar7] = pDVar1[piVar2[sVar7]].keys;
        *(int *)((long)__base + sVar7 * 4) = (int)sVar7;
        sVar7 = sVar7 + 1;
      } while (__nmemb != sVar7);
    }
    qsort(__base,__nmemb,4,cuddZddUniqueCompare);
    iVar3 = table->siftMaxVar;
    if (iVar8 < table->siftMaxVar) {
      iVar3 = iVar8;
    }
    if (0 < iVar3) {
      lVar10 = 0;
LAB_007f5be4:
      if (zddTotalNumberSwapping < table->siftMaxSwap) {
        iVar3 = table->permZ[*(int *)((long)__base + lVar10 * 4)];
        if (upper < iVar3 || iVar3 < lower) goto LAB_007f5d7a;
        initial_size = table->keysZ;
        if (iVar3 == lower) {
          pDVar5 = (DdNode *)cuddZddSiftingDown(table,iVar3,upper,initial_size);
          if (pDVar5 == (DdNode *)0x0) goto LAB_007f5e0a;
          iVar3 = cuddZddSiftingBackward(table,(Move *)pDVar5,initial_size);
          moves = (DdNode *)0x0;
LAB_007f5d10:
          if (iVar3 != 0) {
            if (pDVar5 != (DdNode *)0x0) {
              pDVar6 = table->nextFree;
              do {
                pDVar9 = pDVar5;
                pDVar5 = (pDVar9->type).kids.T;
                pDVar9->ref = 0;
                pDVar9->next = pDVar6;
                pDVar6 = pDVar9;
              } while (pDVar5 != (DdNode *)0x0);
              table->nextFree = pDVar9;
            }
            if (moves != (DdNode *)0x0) {
              pDVar5 = table->nextFree;
              do {
                pDVar6 = moves;
                moves = (pDVar6->type).kids.T;
                pDVar6->ref = 0;
                pDVar6->next = pDVar5;
                pDVar5 = pDVar6;
              } while (moves != (DdNode *)0x0);
              table->nextFree = pDVar6;
            }
            goto LAB_007f5d7a;
          }
        }
        else {
          if (upper == iVar3) {
            moves = (DdNode *)cuddZddSiftingUp(table,iVar3,lower,initial_size);
            if (moves == (DdNode *)0x0) goto LAB_007f5e0a;
            iVar3 = cuddZddSiftingBackward(table,(Move *)moves,initial_size);
            pDVar5 = (DdNode *)0x0;
            goto LAB_007f5d10;
          }
          if (upper - iVar3 < iVar3 - lower) {
            pDVar5 = (DdNode *)cuddZddSiftingDown(table,iVar3,upper,initial_size);
            if (pDVar5 == (DdNode *)0x0) {
LAB_007f5e0a:
              moves = (DdNode *)0x0;
              goto LAB_007f5e0d;
            }
            pDVar6 = (DdNode *)cuddZddSiftingUp(table,pDVar5->ref,lower,initial_size);
            moves = pDVar6;
            if (pDVar6 != (DdNode *)0x0) {
LAB_007f5d0b:
              iVar3 = cuddZddSiftingBackward(table,(Move *)pDVar6,initial_size);
              goto LAB_007f5d10;
            }
            moves = (DdNode *)0x0;
          }
          else {
            moves = (DdNode *)cuddZddSiftingUp(table,iVar3,lower,initial_size);
            if (moves == (DdNode *)0x0) goto LAB_007f5e0a;
            pDVar5 = (DdNode *)cuddZddSiftingDown(table,moves->index,upper,initial_size);
            pDVar6 = pDVar5;
            if (pDVar5 != (DdNode *)0x0) goto LAB_007f5d0b;
LAB_007f5e0d:
            pDVar5 = (DdNode *)0x0;
          }
        }
        if (pDVar5 != (DdNode *)0x0) {
          pDVar6 = table->nextFree;
          do {
            pDVar9 = pDVar5;
            pDVar5 = (pDVar9->type).kids.T;
            pDVar9->ref = 0;
            pDVar9->next = pDVar6;
            pDVar6 = pDVar9;
          } while (pDVar5 != (DdNode *)0x0);
          table->nextFree = pDVar9;
        }
        if (moves != (DdNode *)0x0) {
          pDVar5 = table->nextFree;
          do {
            pDVar6 = moves;
            moves = (pDVar6->type).kids.T;
            pDVar6->ref = 0;
            pDVar6->next = pDVar5;
            pDVar5 = pDVar6;
          } while (moves != (DdNode *)0x0);
          table->nextFree = pDVar6;
        }
        goto LAB_007f5dce;
      }
    }
LAB_007f5d96:
    free(__base);
    iVar8 = 1;
    if (zdd_entry != (int *)0x0) {
      free(zdd_entry);
      zdd_entry = (int *)0x0;
    }
  }
  return iVar8;
LAB_007f5d7a:
  lVar10 = lVar10 + 1;
  iVar3 = table->siftMaxVar;
  if (iVar8 < table->siftMaxVar) {
    iVar3 = iVar8;
  }
  if (iVar3 <= lVar10) goto LAB_007f5d96;
  goto LAB_007f5be4;
}

Assistant:

int
cuddZddSifting(
  DdManager * table,
  int  lower,
  int  upper)
{
    int i;
    int *var;
    int size;
    int x;
    int result;
#ifdef DD_STATS
    int previousSize;
#endif

    size = table->sizeZ;

    /* Find order in which to sift variables. */
    var = NULL;
    zdd_entry = ABC_ALLOC(int, size);
    if (zdd_entry == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto cuddZddSiftingOutOfMem;
    }
    var = ABC_ALLOC(int, size);
    if (var == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto cuddZddSiftingOutOfMem;
    }

    for (i = 0; i < size; i++) {
        x = table->permZ[i];
        zdd_entry[i] = table->subtableZ[x].keys;
        var[i] = i;
    }

    qsort((void *)var, size, sizeof(int), (DD_QSFP)cuddZddUniqueCompare);

    /* Now sift. */
    for (i = 0; i < ddMin(table->siftMaxVar, size); i++) {
        if (zddTotalNumberSwapping >= table->siftMaxSwap)
            break;
        x = table->permZ[var[i]];
        if (x < lower || x > upper) continue;
#ifdef DD_STATS
        previousSize = table->keysZ;
#endif
        result = cuddZddSiftingAux(table, x, lower, upper);
        if (!result)
            goto cuddZddSiftingOutOfMem;
#ifdef DD_STATS
        if (table->keysZ < (unsigned) previousSize) {
            (void) fprintf(table->out,"-");
        } else if (table->keysZ > (unsigned) previousSize) {
            (void) fprintf(table->out,"+");     /* should never happen */
            (void) fprintf(table->out,"\nSize increased from %d to %d while sifting variable %d\n", previousSize, table->keysZ , var[i]);
        } else {
            (void) fprintf(table->out,"=");
        }
        fflush(table->out);
#endif
    }

    ABC_FREE(var);
    ABC_FREE(zdd_entry);

    return(1);

cuddZddSiftingOutOfMem:

    if (zdd_entry != NULL) ABC_FREE(zdd_entry);
    if (var != NULL) ABC_FREE(var);

    return(0);

}